

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_resume_data.cpp
# Opt level: O3

entry * libtorrent::write_torrent_file
                  (entry *__return_storage_ptr__,add_torrent_params *atp,write_torrent_flags_t flags
                  )

{
  element_type *peVar1;
  size_type sVar2;
  pointer pcVar3;
  pointer pvVar4;
  pointer pbVar5;
  __uniq_ptr_data<unsigned_int,_std::default_delete<unsigned_int[]>,_true,_true> _Var6;
  digest32<256L> *pdVar7;
  pointer ppVar8;
  pointer pbVar9;
  node_ptr pcVar10;
  node_ptr pcVar11;
  node_ptr pcVar12;
  node_ptr pcVar13;
  undefined8 uVar14;
  node_ptr pcVar15;
  bool bVar16;
  int iVar17;
  int blocks_per_piece;
  entry *peVar18;
  vector<char,std::allocator<char>> *pvVar19;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> iVar20;
  int64_t iVar21;
  char *pcVar22;
  pointer pvVar23;
  NodePtr commit_data;
  size_holder<true,_unsigned_long,_void> sVar24;
  string_type *psVar25;
  back_insert_iterator<std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>_> bVar26;
  vector<libtorrent::entry,std::allocator<libtorrent::entry>> *pvVar27;
  char cVar28;
  ulong uVar29;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  _Head_base<0UL,_unsigned_int_*,_false> *verified;
  file_index_t index;
  long lVar30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *n;
  torrent_info *this_00;
  pointer ppVar31;
  _Uninitialized<long,_true> _Var32;
  uint uVar33;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar34;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  span<const_libtorrent::digest32<256L>_> t_00;
  span<const_libtorrent::digest32<256L>_> t_01;
  string_view key_04;
  string_view key_05;
  string_view key_06;
  string_view key_07;
  string_view key_08;
  string_view key_09;
  string_view key_10;
  pair<boost::intrusive::compact_rbtree_node<void_*>_*,_bool> pVar35;
  merkle_tree t;
  vector<sha256_hash> piece_layer;
  insert_commit_data data;
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  _Head_base<0UL,_unsigned_int_*,_false> local_158;
  uint local_134;
  torrent_info *local_130;
  reference local_128;
  _Head_base<0UL,_unsigned_int_*,_false> local_120;
  bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
  local_118;
  key_nodeptr_comp<boost::container::dtl::key_node_compare<libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_boost::move_detail::identity<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>_>_>
  local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  compact_rbtree_node<void_*> *local_e8;
  _Alloc_hider local_e0;
  size_type sStack_d8;
  size_type local_d0;
  undefined8 uStack_c8;
  compact_rbtree_node<void_*> *local_c0;
  ulong local_b8;
  string_type local_b0;
  string_type local_90;
  string_type local_70;
  string_type local_50;
  
  local_134 = flags.m_val;
  entry::entry(__return_storage_ptr__);
  peVar1 = (atp->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (peVar1 == (element_type *)0x0) {
    local_178._0_4_ = 4;
    aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              ((error_code_enum *)local_178);
  }
  pcVar22 = (peVar1->m_info_section).px;
  iVar17 = peVar1->m_info_section_size;
  key._M_str = "info";
  key._M_len = 4;
  peVar18 = entry::operator[](__return_storage_ptr__,key);
  uVar33 = local_134;
  pvVar19 = (vector<char,std::allocator<char>> *)entry::preformatted(peVar18);
  ::std::vector<char,std::allocator<char>>::_M_assign_aux<char_const*>
            (pvVar19,pcVar22,pcVar22 + iVar17);
  sVar2 = (atp->comment)._M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (atp->comment)._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar3,pcVar3 + sVar2);
    key_00._M_str = "comment";
    key_00._M_len = 7;
    peVar18 = entry::operator[](__return_storage_ptr__,key_00);
    entry::operator=(peVar18,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  lVar30 = atp->creation_date;
  if (lVar30 != 0) {
    key_01._M_str = "creation date";
    key_01._M_len = 0xd;
    peVar18 = entry::operator[](__return_storage_ptr__,key_01);
    entry::operator=(peVar18,lVar30);
  }
  sVar2 = (atp->created_by)._M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (atp->created_by)._M_dataplus._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char*>((string *)&local_70,pcVar3,pcVar3 + sVar2);
    key_02._M_str = "created by";
    key_02._M_len = 10;
    peVar18 = entry::operator[](__return_storage_ptr__,key_02);
    entry::operator=(peVar18,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  pvVar23 = (atp->merkle_trees).
            super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
            .
            super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar4 = (atp->merkle_trees).
           super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
           .
           super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = (atp->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if (pvVar23 == pvVar4) {
    bVar16 = torrent_info::v2(this_00);
    if (bVar16 && (uVar33 & 1) == 0) {
      local_178._0_4_ = 0xd6;
      aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
                ((error_code_enum *)local_178);
    }
  }
  else {
    iVar17 = file_storage::num_files(&this_00->m_files);
    if (iVar17 != (int)((ulong)((long)pvVar4 - (long)pvVar23) >> 3) * -0x55555555) {
      local_178._0_4_ = 0xd6;
      aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
                ((error_code_enum *)local_178);
    }
    key_03._M_str = "piece layers";
    key_03._M_len = 0xc;
    peVar18 = entry::operator[](__return_storage_ptr__,key_03);
    local_128 = (reference)entry::dict_abi_cxx11_(peVar18);
    local_120._M_head_impl = (uint *)0x0;
    iVar20 = file_storage::file_range(&this_00->m_files);
    local_b8 = (ulong)iVar20 >> 0x20;
    if (iVar20._begin.m_val.m_val != iVar20._end.m_val.m_val) {
      pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (local_198 + 0x10);
      local_c0 = (compact_rbtree_node<void_*> *)
                 &(((tree<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_int,_libtorrent::aux::strview_less,_void,_void>
                     *)&local_128->super_type)->
                  super_node_alloc_holder<boost::container::new_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
                  ).m_icont.
                  super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                  .
                  super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                  .
                  super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                  .
                  super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
      ;
      lVar30 = (long)iVar20._begin.m_val.m_val;
      local_130 = this_00;
      do {
        index.m_val = (int)lVar30;
        bVar16 = file_storage::pad_file_at(&this_00->m_files,index);
        if ((!bVar16) &&
           (iVar21 = file_storage::file_size(&this_00->m_files,index),
           (this_00->m_files).m_piece_length < iVar21)) {
          iVar17 = file_storage::file_num_blocks(&this_00->m_files,index);
          blocks_per_piece = file_storage::blocks_per_piece(&local_130->m_files);
          pcVar22 = file_storage::root_ptr(&local_130->m_files,index);
          aux::merkle_tree::merkle_tree((merkle_tree *)local_178,iVar17,blocks_per_piece,pcVar22);
          pbVar5 = (atp->verified_leaf_hashes).
                   super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
                   super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          verified = (_Head_base<0UL,_unsigned_int_*,_false> *)(pbVar5 + lVar30);
          if ((int)((ulong)((long)(atp->verified_leaf_hashes).
                                  super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                                  .
                                  super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5) >> 3)
              <= lVar30) {
            verified = &local_120;
          }
          pvVar23 = (atp->merkle_trees).
                    super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                    .
                    super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar30;
          pbVar5 = (atp->merkle_tree_mask).
                   super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
                   super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (((lVar30 < (int)((ulong)((long)(atp->merkle_tree_mask).
                                             super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                                             .
                                             super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pbVar5) >> 3)) &&
              (_Var6.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
               super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
                    *(__uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_> *)
                     &pbVar5[lVar30].m_buf.
                      super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>,
              _Var6.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
              super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl !=
              (tuple<unsigned_int_*,_std::default_delete<unsigned_int[]>_>)0x0)) &&
             (*(int *)_Var6.
                      super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t
                      .super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                      super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl != 0)) {
            pdVar7 = *(digest32<256L> **)
                      &(pvVar23->
                       super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                       )._M_impl;
            t_00.m_len = (long)*(pointer *)
                                ((long)&(pvVar23->
                                        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                        )._M_impl + 8) - (long)pdVar7 >> 5;
            t_00.m_ptr = pdVar7;
            aux::merkle_tree::load_sparse_tree
                      ((merkle_tree *)local_178,t_00,pbVar5 + lVar30,(bitfield *)verified);
          }
          else {
            pdVar7 = *(digest32<256L> **)
                      &(pvVar23->
                       super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                       )._M_impl;
            t_01.m_len = (long)*(pointer *)
                                ((long)&(pvVar23->
                                        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                        )._M_impl + 8) - (long)pdVar7 >> 5;
            t_01.m_ptr = pdVar7;
            aux::merkle_tree::load_tree((merkle_tree *)local_178,t_01,(bitfield *)verified);
          }
          aux::merkle_tree::get_piece_layer
                    ((vector<sha256_hash> *)
                     &local_118.
                      super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                      .
                      super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                      .
                      super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
                     ,(merkle_tree *)local_178);
          pcVar10 = local_118.
                    super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                    .
                    super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                    .
                    super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
                    .
                    super_bstbase3<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
                    .holder.root.super_node.left_;
          pcVar13 = local_118.
                    super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                    .
                    super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                    .
                    super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
                    .
                    super_bstbase3<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
                    .holder.root.super_node.parent_;
          iVar17 = file_storage::file_num_pieces(&local_130->m_files,index);
          if (iVar17 != (int)((ulong)((long)pcVar10 - (long)pcVar13) >> 5)) goto LAB_00398c86;
          aux::merkle_tree::root((merkle_tree *)local_178);
          local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x20;
          local_198._0_8_ = pbVar34;
          local_198._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_198,(ulong)&local_f0);
          local_198._16_8_ = local_f0;
          (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198._0_8_)->
          field_2)._M_allocated_capacity = local_d0;
          *(undefined8 *)
           ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_198._0_8_)->field_2 + 8) = uStack_c8;
          (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198._0_8_)->
          _M_dataplus)._M_p = local_e0._M_p;
          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198._0_8_)->
          _M_string_length = sStack_d8;
          local_198._8_8_ = local_f0;
          *(undefined1 *)
           ((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_198._0_8_)->_M_dataplus)._M_p + (long)&(local_f0->_M_dataplus)._M_p) = 0;
          local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)local_f0 & 0xffffffffffffff00);
          local_e8 = (compact_rbtree_node<void_*> *)0x0;
          local_118.
          super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
          .
          super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
          .super_size_holder<true,_unsigned_long,_void>.size_ = (unsigned_long)local_c0;
          local_f8.traits_ =
               (bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>
                *)local_c0;
          pVar35 = boost::intrusive::
                   bstree_algorithms<boost::intrusive::rbtree_node_traits<void*,true>>::
                   insert_unique_check<std::__cxx11::string,boost::intrusive::detail::key_nodeptr_comp<boost::container::dtl::key_node_compare<libtorrent::aux::strview_less,boost::container::dtl::select1st<std::__cxx11::string_const>>,boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<std::__cxx11::string_const,libtorrent::entry>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::rbtree_node_traits<void*,true>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,boost::move_detail::identity<boost::container::dtl::tree_node<std::pair<std::__cxx11::string_const,libtorrent::entry>,void*,(boost::container::tree_type_enum)0,true>>>>
                             ((const_node_ptr *)&local_118,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_198,&local_f8,(insert_commit_data *)&local_f0,(size_t *)0x0);
          sVar24.size_ = (unsigned_long)pVar35.first;
          if (((undefined1  [16])pVar35 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            commit_data = boost::container::dtl::
                          node_alloc_holder<boost::container::new_allocator<std::pair<std::__cxx11::string_const,libtorrent::entry>>,boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<std::__cxx11::string_const,libtorrent::entry>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::rbtree_node_traits<void*,true>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,void,boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<std::__cxx11::string_const,libtorrent::entry>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::tree_value_compare<std::pair<std::__cxx11::string_const,libtorrent::entry>*,libtorrent::aux::strview_less,boost::container::dtl::select1st<std::__cxx11::string_const>,bool,false>,bool>,unsigned_long,true,void>>
                          ::create_node<boost::container::try_emplace_t,std::__cxx11::string>
                                    ((node_alloc_holder<boost::container::new_allocator<std::pair<std::__cxx11::string_const,libtorrent::entry>>,boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<std::__cxx11::string_const,libtorrent::entry>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::rbtree_node_traits<void*,true>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,void,boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<std::__cxx11::string_const,libtorrent::entry>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::tree_value_compare<std::pair<std::__cxx11::string_const,libtorrent::entry>*,libtorrent::aux::strview_less,boost::container::dtl::select1st<std::__cxx11::string_const>,bool,false>,bool>,unsigned_long,true,void>>
                                      *)local_128,(try_emplace_t *)&local_f8,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_198);
            boost::intrusive::
            bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
            ::insert_unique_commit(&local_118,local_128,(insert_commit_data *)commit_data);
            sVar24.size_ = local_118.
                           super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                           .
                           super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                           .super_size_holder<true,_unsigned_long,_void>.size_;
          }
          if ((compact_rbtree_node<void_*> *)sVar24.size_ == (compact_rbtree_node<void_*> *)0x0) {
            __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                          "static pointer boost::intrusive::bhtraits_base<boost::container::dtl::tree_node<std::pair<const std::basic_string<char>, libtorrent::entry>, void *, boost::container::red_black_tree, true>, boost::intrusive::compact_rbtree_node<void *> *, boost::intrusive::dft_tag, 3>::to_value_ptr(const node_ptr &) [T = boost::container::dtl::tree_node<std::pair<const std::basic_string<char>, libtorrent::entry>, void *, boost::container::red_black_tree, true>, NodePtr = boost::intrusive::compact_rbtree_node<void *> *, Tag = boost::intrusive::dft_tag, Type = 3]"
                         );
          }
          psVar25 = entry::string_abi_cxx11_
                              ((entry *)&((compact_rbtree_node<void_*> *)(sVar24.size_ + 0x30))->
                                         left_);
          pcVar13 = local_118.
                    super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                    .
                    super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                    .
                    super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
                    .
                    super_bstbase3<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
                    .holder.root.super_node.parent_;
          pcVar10 = local_118.
                    super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                    .
                    super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                    .
                    super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
                    .
                    super_bstbase3<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
                    .holder.root.super_node.left_;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198._0_8_
              != pbVar34) {
            operator_delete((void *)local_198._0_8_,(ulong)(local_198._16_8_ + 1));
            pcVar13 = local_118.
                      super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                      .
                      super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                      .
                      super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
                      .
                      super_bstbase3<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
                      .holder.root.super_node.parent_;
            pcVar10 = local_118.
                      super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                      .
                      super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                      .
                      super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
                      .
                      super_bstbase3<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
                      .holder.root.super_node.left_;
          }
          for (; pcVar15 = local_118.
                           super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                           .
                           super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                           .
                           super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
                           .
                           super_bstbase3<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
                           .holder.root.super_node.left_,
              pcVar13 !=
              local_118.
              super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
              .
              super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
              .
              super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
              .
              super_bstbase3<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
              .holder.root.super_node.left_; pcVar13 = (node_ptr)&pcVar13[1].left_) {
            if (pcVar13 == (node_ptr)0x0) {
              local_198._0_8_ = pbVar34;
              ::std::__throw_logic_error("basic_string::_M_construct null not valid");
              goto LAB_00398c7a;
            }
            local_e0._M_p = (pointer)0x20;
            local_198._0_8_ = pbVar34;
            local_118.
            super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
            .
            super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
            .
            super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
            .
            super_bstbase3<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
            .holder.root.super_node.left_ = pcVar10;
            local_198._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_198,(ulong)&local_e0)
            ;
            local_198._16_8_ = local_e0._M_p;
            pcVar10 = pcVar13->parent_;
            pcVar11 = pcVar13->left_;
            pcVar12 = pcVar13[1].parent_;
            (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198._0_8_)
            ->field_2)._M_allocated_capacity = (size_type)pcVar13->right_;
            *(node_ptr *)
             ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_198._0_8_)->field_2 + 8) = pcVar12;
            (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198._0_8_)
            ->_M_dataplus)._M_p = (pointer)pcVar10;
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198._0_8_)->
            _M_string_length = (size_type)pcVar11;
            local_198._8_8_ = local_e0._M_p;
            *((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_198._0_8_)->_M_dataplus)._M_p + local_e0._M_p) = '\0';
            ::std::__cxx11::string::_M_append((char *)psVar25,local_198._0_8_);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198._0_8_
                != pbVar34) {
              operator_delete((void *)local_198._0_8_,(ulong)(local_198._16_8_ + 1));
            }
            pcVar10 = local_118.
                      super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                      .
                      super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                      .
                      super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
                      .
                      super_bstbase3<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
                      .holder.root.super_node.left_;
            local_118.
            super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
            .
            super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
            .
            super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
            .
            super_bstbase3<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
            .holder.root.super_node.left_ = pcVar15;
          }
          local_118.
          super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
          .
          super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
          .
          super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
          .
          super_bstbase3<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
          .holder.root.super_node.left_ = pcVar10;
          if (local_118.
              super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
              .
              super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
              .
              super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
              .
              super_bstbase3<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
              .holder.root.super_node.parent_ != (node_ptr)0x0) {
            operator_delete(local_118.
                            super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                            .
                            super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                            .
                            super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
                            .
                            super_bstbase3<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
                            .holder.root.super_node.parent_,
                            (long)local_118.
                                  super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                                  .
                                  super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                                  .
                                  super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
                                  .
                                  super_bstbase3<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
                                  .holder.root.super_node.right_ -
                            (long)local_118.
                                  super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                                  .
                                  super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                                  .
                                  super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
                                  .
                                  super_bstbase3<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
                                  .holder.root.super_node.parent_);
          }
          uVar33 = local_134;
          if ((tuple<unsigned_int_*,_std::default_delete<unsigned_int[]>_>)local_158._M_head_impl !=
              (_Head_base<0UL,_unsigned_int_*,_false>)0x0) {
            operator_delete__(local_158._M_head_impl);
          }
          this_00 = local_130;
          local_158._M_head_impl = (uint *)0x0;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178._8_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            operator_delete((void *)local_178._8_8_,local_178._24_8_ - local_178._8_8_);
          }
        }
        lVar30 = lVar30 + 1;
      } while ((int)lVar30 != (int)local_b8);
    }
    if (local_120._M_head_impl != (uint *)0x0) {
      operator_delete__(local_120._M_head_impl);
    }
  }
  cVar28 = (char)((uVar33 & 2) >> 1);
  if (cVar28 == '\0' &&
      (atp->url_seeds).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (atp->url_seeds).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    key_04._M_str = "url-list";
    key_04._M_len = 8;
    peVar18 = entry::operator[](__return_storage_ptr__,key_04);
    bVar26.container = entry::list(peVar18);
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::reserve
              (bVar26.container,
               (long)(atp->url_seeds).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(atp->url_seeds).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
    ::std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<std::__cxx11::string_const*,std::back_insert_iterator<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>>
              ((atp->url_seeds).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (atp->url_seeds).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,bVar26);
  }
  if ((atp->http_seeds).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (atp->http_seeds).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish && cVar28 == '\0') {
    key_05._M_str = "httpseeds";
    key_05._M_len = 9;
    peVar18 = entry::operator[](__return_storage_ptr__,key_05);
    bVar26.container = entry::list(peVar18);
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::reserve
              (bVar26.container,
               (long)(atp->http_seeds).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(atp->http_seeds).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
    ::std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<std::__cxx11::string_const*,std::back_insert_iterator<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>>
              ((atp->http_seeds).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (atp->http_seeds).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,bVar26);
  }
  if (((byte)((uVar33 & 4) >> 2) &
      (atp->dht_nodes).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (atp->dht_nodes).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) == 1) {
    key_06._M_str = "nodes";
    key_06._M_len = 5;
    peVar18 = entry::operator[](__return_storage_ptr__,key_06);
    pvVar27 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)entry::list(peVar18);
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::reserve
              ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)pvVar27,
               ((long)(atp->dht_nodes).
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(atp->dht_nodes).
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333);
    ppVar31 = (atp->dht_nodes).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar8 = (atp->dht_nodes).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar31 != ppVar8) {
      do {
        ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::vector
                  ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)local_178,2,
                   (allocator_type *)local_198);
        pcVar3 = (ppVar31->first)._M_dataplus._M_p;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar3,pcVar3 + (ppVar31->first)._M_string_length);
        entry::operator=((entry *)local_178._0_8_,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        entry::operator=((entry *)(local_178._0_8_ + 0x28),(long)ppVar31->second);
        ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
        emplace_back<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>
                  (pvVar27,(vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)
                           local_178);
        ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::~vector
                  ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)local_178);
        ppVar31 = ppVar31 + 1;
      } while (ppVar31 != ppVar8);
    }
  }
  torrent_info::similar_torrents
            ((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *)
             local_198,
             (atp->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  if (local_198._0_8_ == local_198._8_8_) {
    bVar16 = false;
  }
  else {
    torrent_info::info((bdecode_node *)local_178,
                       (atp->ti).
                       super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,"similar");
    bVar16 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_178);
    if (local_178._0_8_ != 0) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ - local_178._0_8_);
    }
    bVar16 = !bVar16;
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_198._0_8_,local_198._16_8_ - local_198._0_8_);
  }
  if (bVar16) {
    key_07._M_str = "similar";
    key_07._M_len = 7;
    peVar18 = entry::operator[](__return_storage_ptr__,key_07);
    pvVar27 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)entry::list(peVar18);
    torrent_info::similar_torrents
              ((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *)
               local_178,
               (atp->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::reserve
              ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)pvVar27,
               ((long)(local_178._8_8_ - local_178._0_8_) >> 2) * -0x3333333333333333);
    if (local_178._0_8_ != 0) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ - local_178._0_8_);
    }
    torrent_info::similar_torrents
              ((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *)
               local_198,
               (atp->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    uVar14 = local_198._8_8_;
    if (local_198._0_8_ != local_198._8_8_) {
      _Var32._M_storage = (long)local_178 + 0x10;
      pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198._0_8_
      ;
      do {
        local_178._0_8_ = _Var32._M_storage;
        if (pbVar34 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
LAB_00398c7a:
          ::std::__throw_logic_error("basic_string::_M_construct null not valid");
LAB_00398c86:
          local_198._0_4_ = 0xd7;
          aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
                    ((error_code_enum *)local_198);
        }
        local_e0._M_p = (pointer)0x14;
        local_178._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_178,(ulong)&local_e0);
        local_178._16_8_ = local_e0._M_p;
        *(undefined4 *)(local_178._0_8_ + 0x10) = *(undefined4 *)&pbVar34->field_2;
        sVar2 = pbVar34->_M_string_length;
        *(pointer *)local_178._0_8_ = (pbVar34->_M_dataplus)._M_p;
        *(size_type *)(local_178._0_8_ + 8) = sVar2;
        local_178._8_8_ = local_e0._M_p;
        local_e0._M_p[local_178._0_8_] = '\0';
        ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
        emplace_back<std::__cxx11::string>
                  (pvVar27,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_178);
        if (local_178._0_8_ != _Var32._M_storage) {
          operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
        }
        pbVar34 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((pbVar34->field_2)._M_local_buf + 4);
      } while (pbVar34 !=
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar14);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete((void *)local_198._0_8_,local_198._16_8_ - local_198._0_8_);
    }
  }
  torrent_info::collections_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_198,
             (atp->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  if (local_198._0_8_ == local_198._8_8_) {
    this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_198;
  }
  else {
    torrent_info::info((bdecode_node *)local_178,
                       (atp->ti).
                       super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,"collections");
    bVar16 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_178);
    if (local_178._0_8_ != 0) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ - local_178._0_8_);
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_198);
    if (bVar16) goto LAB_00398b95;
    key_08._M_str = "collections";
    key_08._M_len = 0xb;
    peVar18 = entry::operator[](__return_storage_ptr__,key_08);
    pvVar27 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)entry::list(peVar18);
    torrent_info::collections_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_178,
               (atp->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::reserve
              ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)pvVar27,
               (long)(local_178._8_8_ - local_178._0_8_) >> 5);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_178);
    torrent_info::collections_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_178,
               (atp->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    uVar14 = local_178._8_8_;
    for (_Var32._M_storage = local_178._0_8_; _Var32._M_storage != uVar14;
        _Var32._M_storage = _Var32._M_storage + 0x20) {
      ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
      emplace_back<std::__cxx11::string_const&>
                (pvVar27,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         _Var32._M_storage);
    }
    this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_178;
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(this);
LAB_00398b95:
  pbVar9 = (atp->trackers).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar29 = (long)(atp->trackers).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9;
  if (uVar29 == 0x20) {
    pcVar3 = (pbVar9->_M_dataplus)._M_p;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar3,pcVar3 + pbVar9->_M_string_length);
    key_09._M_str = "announce";
    key_09._M_len = 8;
    peVar18 = entry::operator[](__return_storage_ptr__,key_09);
    entry::operator=(peVar18,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  else if (0x20 < uVar29) {
    anon_unknown_23::build_tracker_list((entry *)local_178,&atp->trackers,&atp->tracker_tiers);
    key_10._M_str = "announce-list";
    key_10._M_len = 0xd;
    peVar18 = entry::operator[](__return_storage_ptr__,key_10);
    entry::operator=(peVar18,(entry *)local_178);
    entry::~entry((entry *)local_178);
  }
  return __return_storage_ptr__;
}

Assistant:

entry write_torrent_file(add_torrent_params const& atp, write_torrent_flags_t const flags)
	{
		entry ret;
		if (!atp.ti)
			aux::throw_ex<system_error>(errors::torrent_missing_info);

		auto const info = atp.ti->info_section();
		ret["info"].preformatted().assign(info.data(), info.data() + info.size());

		if (!atp.comment.empty())
			ret["comment"] = atp.comment;
		if (atp.creation_date != 0)
			ret["creation date"] = atp.creation_date;
		if (!atp.created_by.empty())
			ret["created by"] = atp.created_by;

		if (!atp.merkle_trees.empty())
		{
			file_storage const& fs = atp.ti->files();
			auto& trees = atp.merkle_trees;
			if (int(trees.size()) != fs.num_files())
				aux::throw_ex<system_error>(errors::torrent_missing_piece_layer);

			auto& piece_layers = ret["piece layers"].dict();
			bitfield const empty_verified;
			for (file_index_t f : fs.file_range())
			{
				if (fs.pad_file_at(f) || fs.file_size(f) <= fs.piece_length())
					continue;

				aux::merkle_tree t(fs.file_num_blocks(f), fs.blocks_per_piece(), fs.root_ptr(f));

				bitfield const& verified = (f >= atp.verified_leaf_hashes.end_index())
					? empty_verified : atp.verified_leaf_hashes[f];

				auto const& tree = trees[f];
				if (f < atp.merkle_tree_mask.end_index() && !atp.merkle_tree_mask[f].empty())
				{
					t.load_sparse_tree(tree, atp.merkle_tree_mask[f], verified);
				}
				else
				{
					t.load_tree(tree, verified);
				}

				auto const piece_layer = t.get_piece_layer();
				if (int(piece_layer.size()) != fs.file_num_pieces(f))
					aux::throw_ex<system_error>(errors::torrent_invalid_piece_layer);

				auto& layer = piece_layers[t.root().to_string()].string();

				for (auto const& h : piece_layer)
					layer += h.to_string();
			}
		}
		else if (atp.ti->v2() && !(flags & write_flags::allow_missing_piece_layer))
		{
			// we must have piece layers for v2 torrents for them to be valid
			// .torrent files
			aux::throw_ex<system_error>(errors::torrent_missing_piece_layer);
		}

		// save web seeds
		if (!atp.url_seeds.empty() && !(flags & write_flags::no_http_seeds))
		{
			auto& url_list = ret["url-list"].list();
			url_list.reserve(atp.url_seeds.size());
			std::copy(atp.url_seeds.begin(), atp.url_seeds.end(), std::back_inserter(url_list));
		}

#if TORRENT_ABI_VERSION < 4
		if (!atp.http_seeds.empty() && !(flags & write_flags::no_http_seeds))
		{
			auto& httpseeds_list = ret["httpseeds"].list();
			httpseeds_list.reserve(atp.http_seeds.size());
			std::copy(atp.http_seeds.begin(), atp.http_seeds.end(), std::back_inserter(httpseeds_list));
		}
#endif

		// save DHT nodes
		if (!atp.dht_nodes.empty() && (flags & write_flags::include_dht_nodes))
		{
			auto& nodes = ret["nodes"].list();
			nodes.reserve(atp.dht_nodes.size());
			for (auto const& n : atp.dht_nodes)
			{
				entry::list_type node(2);
				node[0] = std::move(n.first);
				node[1] = n.second;
				nodes.emplace_back(std::move(node));
			}
		}

		if (!atp.ti->similar_torrents().empty() && !atp.ti->info("similar"))
		{
			auto& l = ret["similar"].list();
			l.reserve(atp.ti->similar_torrents().size());
			for (auto const& n : atp.ti->similar_torrents())
				l.emplace_back(n.to_string());
		}

		if (!atp.ti->collections().empty() && !atp.ti->info("collections"))
		{
			auto& l = ret["collections"].list();
			l.reserve(atp.ti->collections().size());
			for (auto const& n : atp.ti->collections())
				l.emplace_back(n);
		}

		// save trackers
		if (atp.trackers.size() == 1)
			ret["announce"] = atp.trackers.front();
		else if (atp.trackers.size() > 1)
			ret["announce-list"] = build_tracker_list(atp.trackers, atp.tracker_tiers);

		return ret;
	}